

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConversionFuncs.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::builtins::BitsToShortRealFunction::eval
          (BitsToShortRealFunction *this,EvalContext *context,Args *args,SourceRange param_4,
          SystemCallInfo *param_5)

{
  bool bVar1;
  shortreal_t real;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_RCX;
  ConstantValue *in_RDI;
  float v;
  uint32_t i;
  ConstantValue val;
  ConstantValue *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  Expression *in_stack_ffffffffffffff58;
  ConstantValue *this_00;
  shortreal_t local_7c;
  undefined4 local_78;
  _Optional_payload_base<unsigned_int> local_74;
  float local_6c [27];
  
  this_00 = in_RDI;
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RCX,0);
  Expression::eval(in_stack_ffffffffffffff58,
                   (EvalContext *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0xaeba41);
  if (bVar1) {
    slang::ConstantValue::integer((ConstantValue *)0xaeba95);
    local_74 = (_Optional_payload_base<unsigned_int>)SVInt::as<unsigned_int>((SVInt *)this_00);
    local_78 = 0;
    real.v = (float)std::optional<unsigned_int>::value_or<int>
                              ((optional<unsigned_int> *)local_74,
                               (int *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50))
    ;
    local_6c[0] = real.v;
    v = std::bit_cast<float,_unsigned_int>((uint *)local_6c);
    shortreal_t::shortreal_t(&local_7c,v);
    slang::ConstantValue::ConstantValue(in_stack_ffffffffffffff48,real);
  }
  else {
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
               in_stack_ffffffffffffff48);
  }
  local_6c[1] = 1.4013e-45;
  slang::ConstantValue::~ConstantValue((ConstantValue *)0xaebb16);
  return in_RDI;
}

Assistant:

ConstantValue eval(EvalContext& context, const Args& args, SourceRange,
                       const CallExpression::SystemCallInfo&) const final {
        auto val = args[0]->eval(context);
        if (!val)
            return nullptr;

        uint32_t i = val.integer().as<uint32_t>().value_or(0);
        return shortreal_t(std::bit_cast<float>(i));
    }